

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeTextureApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::bindtexture(NegativeTestContext *ctx)

{
  NegativeTestContext *pNVar1;
  bool bVar2;
  ContextType ctxType;
  ApiType requiredApiType;
  RenderContext *pRVar3;
  ContextInfo *this;
  allocator<char> local_81;
  string local_80;
  allocator<char> local_49;
  string local_48;
  GLuint local_28;
  GLuint local_24;
  GLuint texture [5];
  NegativeTestContext *ctx_local;
  
  unique0x100005c4 = ctx;
  glu::CallLogWrapper::glGenTextures(&ctx->super_CallLogWrapper,5,&local_28);
  pNVar1 = stack0xfffffffffffffff0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,
             "GL_INVALID_ENUM is generated if target is not one of the allowable values.",&local_49)
  ;
  NegativeTestContext::beginSection(pNVar1,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  glu::CallLogWrapper::glBindTexture(&stack0xfffffffffffffff0->super_CallLogWrapper,0,1);
  NegativeTestContext::expectError(stack0xfffffffffffffff0,0x500);
  glu::CallLogWrapper::glBindTexture(&stack0xfffffffffffffff0->super_CallLogWrapper,0x8d40,1);
  NegativeTestContext::expectError(stack0xfffffffffffffff0,0x500);
  NegativeTestContext::endSection(stack0xfffffffffffffff0);
  pNVar1 = stack0xfffffffffffffff0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,
             "GL_INVALID_OPERATION is generated if texture was previously created with a target that doesn\'t match that of target."
             ,&local_81);
  NegativeTestContext::beginSection(pNVar1,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  glu::CallLogWrapper::glBindTexture(&stack0xfffffffffffffff0->super_CallLogWrapper,0xde1,local_28);
  NegativeTestContext::expectError(stack0xfffffffffffffff0,0);
  glu::CallLogWrapper::glBindTexture(&stack0xfffffffffffffff0->super_CallLogWrapper,0x8513,local_28)
  ;
  NegativeTestContext::expectError(stack0xfffffffffffffff0,0x502);
  glu::CallLogWrapper::glBindTexture(&stack0xfffffffffffffff0->super_CallLogWrapper,0x806f,local_28)
  ;
  NegativeTestContext::expectError(stack0xfffffffffffffff0,0x502);
  glu::CallLogWrapper::glBindTexture(&stack0xfffffffffffffff0->super_CallLogWrapper,0x8c1a,local_28)
  ;
  NegativeTestContext::expectError(stack0xfffffffffffffff0,0x502);
  glu::CallLogWrapper::glBindTexture(&stack0xfffffffffffffff0->super_CallLogWrapper,0x8513,local_24)
  ;
  NegativeTestContext::expectError(stack0xfffffffffffffff0,0);
  glu::CallLogWrapper::glBindTexture(&stack0xfffffffffffffff0->super_CallLogWrapper,0xde1,local_24);
  NegativeTestContext::expectError(stack0xfffffffffffffff0,0x502);
  glu::CallLogWrapper::glBindTexture(&stack0xfffffffffffffff0->super_CallLogWrapper,0x806f,local_24)
  ;
  NegativeTestContext::expectError(stack0xfffffffffffffff0,0x502);
  glu::CallLogWrapper::glBindTexture(&stack0xfffffffffffffff0->super_CallLogWrapper,0x8c1a,local_24)
  ;
  NegativeTestContext::expectError(stack0xfffffffffffffff0,0x502);
  glu::CallLogWrapper::glBindTexture
            (&stack0xfffffffffffffff0->super_CallLogWrapper,0x806f,texture[0]);
  NegativeTestContext::expectError(stack0xfffffffffffffff0,0);
  glu::CallLogWrapper::glBindTexture
            (&stack0xfffffffffffffff0->super_CallLogWrapper,0xde1,texture[0]);
  NegativeTestContext::expectError(stack0xfffffffffffffff0,0x502);
  glu::CallLogWrapper::glBindTexture
            (&stack0xfffffffffffffff0->super_CallLogWrapper,0x8513,texture[0]);
  NegativeTestContext::expectError(stack0xfffffffffffffff0,0x502);
  glu::CallLogWrapper::glBindTexture
            (&stack0xfffffffffffffff0->super_CallLogWrapper,0x8c1a,texture[0]);
  NegativeTestContext::expectError(stack0xfffffffffffffff0,0x502);
  glu::CallLogWrapper::glBindTexture
            (&stack0xfffffffffffffff0->super_CallLogWrapper,0x8c1a,texture[1]);
  NegativeTestContext::expectError(stack0xfffffffffffffff0,0);
  glu::CallLogWrapper::glBindTexture
            (&stack0xfffffffffffffff0->super_CallLogWrapper,0xde1,texture[1]);
  NegativeTestContext::expectError(stack0xfffffffffffffff0,0x502);
  glu::CallLogWrapper::glBindTexture
            (&stack0xfffffffffffffff0->super_CallLogWrapper,0x8513,texture[1]);
  NegativeTestContext::expectError(stack0xfffffffffffffff0,0x502);
  glu::CallLogWrapper::glBindTexture
            (&stack0xfffffffffffffff0->super_CallLogWrapper,0x806f,texture[1]);
  NegativeTestContext::expectError(stack0xfffffffffffffff0,0x502);
  pRVar3 = NegativeTestContext::getRenderContext(stack0xfffffffffffffff0);
  ctxType.super_ApiType.m_bits = (ApiType)(*pRVar3->_vptr_RenderContext[2])();
  requiredApiType = glu::ApiType::es(3,2);
  bVar2 = glu::contextSupports(ctxType,requiredApiType);
  if (!bVar2) {
    this = NegativeTestContext::getContextInfo(stack0xfffffffffffffff0);
    bVar2 = glu::ContextInfo::isExtensionSupported(this,"GL_OES_texture_cube_map_array");
    if (!bVar2) goto LAB_022b845a;
  }
  glu::CallLogWrapper::glBindTexture(&stack0xfffffffffffffff0->super_CallLogWrapper,0x9009,local_28)
  ;
  NegativeTestContext::expectError(stack0xfffffffffffffff0,0x502);
  glu::CallLogWrapper::glBindTexture(&stack0xfffffffffffffff0->super_CallLogWrapper,0x9009,local_24)
  ;
  NegativeTestContext::expectError(stack0xfffffffffffffff0,0x502);
  glu::CallLogWrapper::glBindTexture
            (&stack0xfffffffffffffff0->super_CallLogWrapper,0x9009,texture[0]);
  NegativeTestContext::expectError(stack0xfffffffffffffff0,0x502);
  glu::CallLogWrapper::glBindTexture
            (&stack0xfffffffffffffff0->super_CallLogWrapper,0x9009,texture[1]);
  NegativeTestContext::expectError(stack0xfffffffffffffff0,0x502);
  glu::CallLogWrapper::glBindTexture
            (&stack0xfffffffffffffff0->super_CallLogWrapper,0x9009,texture[2]);
  NegativeTestContext::expectError(stack0xfffffffffffffff0,0);
  glu::CallLogWrapper::glBindTexture
            (&stack0xfffffffffffffff0->super_CallLogWrapper,0xde1,texture[2]);
  NegativeTestContext::expectError(stack0xfffffffffffffff0,0x502);
  glu::CallLogWrapper::glBindTexture
            (&stack0xfffffffffffffff0->super_CallLogWrapper,0x8513,texture[2]);
  NegativeTestContext::expectError(stack0xfffffffffffffff0,0x502);
  glu::CallLogWrapper::glBindTexture
            (&stack0xfffffffffffffff0->super_CallLogWrapper,0x806f,texture[2]);
  NegativeTestContext::expectError(stack0xfffffffffffffff0,0x502);
  glu::CallLogWrapper::glBindTexture
            (&stack0xfffffffffffffff0->super_CallLogWrapper,0x8c1a,texture[2]);
  NegativeTestContext::expectError(stack0xfffffffffffffff0,0x502);
LAB_022b845a:
  NegativeTestContext::endSection(stack0xfffffffffffffff0);
  glu::CallLogWrapper::glDeleteTextures(&stack0xfffffffffffffff0->super_CallLogWrapper,5,&local_28);
  return;
}

Assistant:

void bindtexture (NegativeTestContext& ctx)
{
	GLuint texture[5];
	ctx.glGenTextures(5, texture);

	ctx.beginSection("GL_INVALID_ENUM is generated if target is not one of the allowable values.");
	ctx.glBindTexture(0, 1);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glBindTexture(GL_FRAMEBUFFER, 1);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if texture was previously created with a target that doesn't match that of target.");
	ctx.glBindTexture(GL_TEXTURE_2D, texture[0]);
	ctx.expectError(GL_NO_ERROR);
	ctx.glBindTexture(GL_TEXTURE_CUBE_MAP, texture[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glBindTexture(GL_TEXTURE_3D, texture[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glBindTexture(GL_TEXTURE_2D_ARRAY, texture[0]);
	ctx.expectError(GL_INVALID_OPERATION);

	ctx.glBindTexture(GL_TEXTURE_CUBE_MAP, texture[1]);
	ctx.expectError(GL_NO_ERROR);
	ctx.glBindTexture(GL_TEXTURE_2D, texture[1]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glBindTexture(GL_TEXTURE_3D, texture[1]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glBindTexture(GL_TEXTURE_2D_ARRAY, texture[1]);
	ctx.expectError(GL_INVALID_OPERATION);

	ctx.glBindTexture(GL_TEXTURE_3D, texture[2]);
	ctx.expectError(GL_NO_ERROR);
	ctx.glBindTexture(GL_TEXTURE_2D, texture[2]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glBindTexture(GL_TEXTURE_CUBE_MAP, texture[2]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glBindTexture(GL_TEXTURE_2D_ARRAY, texture[2]);
	ctx.expectError(GL_INVALID_OPERATION);

	ctx.glBindTexture(GL_TEXTURE_2D_ARRAY, texture[3]);
	ctx.expectError(GL_NO_ERROR);
	ctx.glBindTexture(GL_TEXTURE_2D, texture[3]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glBindTexture(GL_TEXTURE_CUBE_MAP, texture[3]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glBindTexture(GL_TEXTURE_3D, texture[3]);
	ctx.expectError(GL_INVALID_OPERATION);

	if (contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) || ctx.getContextInfo().isExtensionSupported("GL_OES_texture_cube_map_array"))
	{
		ctx.glBindTexture(GL_TEXTURE_CUBE_MAP_ARRAY, texture[0]);
		ctx.expectError(GL_INVALID_OPERATION);
		ctx.glBindTexture(GL_TEXTURE_CUBE_MAP_ARRAY, texture[1]);
		ctx.expectError(GL_INVALID_OPERATION);
		ctx.glBindTexture(GL_TEXTURE_CUBE_MAP_ARRAY, texture[2]);
		ctx.expectError(GL_INVALID_OPERATION);
		ctx.glBindTexture(GL_TEXTURE_CUBE_MAP_ARRAY, texture[3]);
		ctx.expectError(GL_INVALID_OPERATION);
		ctx.glBindTexture(GL_TEXTURE_CUBE_MAP_ARRAY, texture[4]);
		ctx.expectError(GL_NO_ERROR);
		ctx.glBindTexture(GL_TEXTURE_2D, texture[4]);
		ctx.expectError(GL_INVALID_OPERATION);
		ctx.glBindTexture(GL_TEXTURE_CUBE_MAP, texture[4]);
		ctx.expectError(GL_INVALID_OPERATION);
		ctx.glBindTexture(GL_TEXTURE_3D, texture[4]);
		ctx.expectError(GL_INVALID_OPERATION);
		ctx.glBindTexture(GL_TEXTURE_2D_ARRAY, texture[4]);
		ctx.expectError(GL_INVALID_OPERATION);
	}
	ctx.endSection();

	ctx.glDeleteTextures(5, texture);
}